

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O3

void __thiscall t_java_generator::generate_java_union(t_java_generator *this,t_struct *tstruct)

{
  _func_int **pp_Var1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 *puVar6;
  long *plVar7;
  ostream *poVar8;
  iterator iVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar10;
  long lVar11;
  t_struct *tstruct_00;
  t_struct *tstruct_01;
  t_struct *tstruct_02;
  t_java_generator *this_01;
  char *pcVar12;
  undefined8 uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string f_struct_name;
  size_type __dnew;
  ofstream_with_content_based_conditional_update f_struct;
  key_type local_258;
  string local_238;
  long *local_218;
  long local_210;
  long local_208 [2];
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  long lStack_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  _func_int *local_1c0 [12];
  string local_160 [32];
  undefined1 local_140;
  ios_base local_138 [264];
  
  paVar2 = &local_258.field_2;
  pcVar3 = (this->package_dir_)._M_dataplus._M_p;
  local_258._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar3,pcVar3 + (this->package_dir_)._M_string_length);
  this_01 = (t_java_generator *)0x378461;
  std::__cxx11::string::append((char *)&local_258);
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  make_valid_java_identifier(&local_238,this_01,(string *)CONCAT44(extraout_var,iVar5));
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    uVar13 = local_258.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_238._M_string_length + local_258._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      uVar13 = local_238.field_2._M_allocated_capacity;
    }
    if (local_238._M_string_length + local_258._M_string_length <= (ulong)uVar13) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_238,0,(char *)0x0,(ulong)local_258._M_dataplus._M_p);
      goto LAB_00247c16;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_238._M_dataplus._M_p);
LAB_00247c16:
  local_1d0._0_8_ = local_1c0;
  pp_Var1 = (_func_int **)(puVar6 + 2);
  if ((_func_int **)*puVar6 == pp_Var1) {
    local_1c0[0] = *pp_Var1;
    local_1c0[1] = (_func_int *)puVar6[3];
  }
  else {
    local_1c0[0] = *pp_Var1;
    local_1d0._0_8_ = (_func_int **)*puVar6;
  }
  local_1d0._8_8_ = puVar6[1];
  *puVar6 = pp_Var1;
  puVar6[1] = 0;
  *(undefined1 *)pp_Var1 = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_1d0);
  local_1f8 = &local_1e8;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_1e8 = *plVar10;
    lStack_1e0 = plVar7[3];
  }
  else {
    local_1e8 = *plVar10;
    local_1f8 = (long *)*plVar7;
  }
  local_1f0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((_func_int **)local_1d0._0_8_ != local_1c0) {
    operator_delete((void *)local_1d0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  std::__cxx11::string::string((string *)&local_258,(char *)local_1f8,(allocator *)&local_238);
  std::__cxx11::string::_M_assign(local_160);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  local_140 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_258,this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,local_258._M_dataplus._M_p,local_258._M_string_length);
  java_package_abi_cxx11_(&local_238,this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,local_238._M_dataplus._M_p,local_238._M_string_length);
  local_1d8 = 0x49;
  local_218 = local_208;
  plVar7 = (long *)std::__cxx11::string::_M_create((ulong *)&local_218,(ulong)&local_1d8);
  lVar11 = local_1d8;
  local_208[0] = local_1d8;
  local_218 = plVar7;
  memcpy(plVar7,
         "@SuppressWarnings({\"cast\", \"rawtypes\", \"serial\", \"unchecked\", \"unused\"})\n",0x49
        );
  local_210 = lVar11;
  *(undefined1 *)((long)plVar7 + lVar11) = 0;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_218,lVar11);
  paVar2 = &local_258.field_2;
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])(this,local_1d0,tstruct)
  ;
  local_258._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"final","");
  this_00 = &(tstruct->super_t_type).annotations_;
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  bVar4 = is_deprecated(this,this_00);
  if (this->suppress_generated_annotations_ == false) {
    generate_javax_generated_annotation(this,(ostream *)local_1d0);
  }
  if (bVar4) {
    poVar8 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"@Deprecated",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public ",7);
  bVar4 = (_Rb_tree_header *)iVar9._M_node ==
          &(tstruct->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header;
  pcVar12 = "final ";
  if (bVar4) {
    pcVar12 = "";
  }
  lVar11 = 6;
  if (bVar4) {
    lVar11 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar12,lVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"class ",6);
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,*(char **)CONCAT44(extraout_var_00,iVar5),
                      ((undefined8 *)CONCAT44(extraout_var_00,iVar5))[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8," extends org.apache.thrift.TUnion<",0x22);
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,*(char **)CONCAT44(extraout_var_01,iVar5),
                      ((undefined8 *)CONCAT44(extraout_var_01,iVar5))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,*(char **)CONCAT44(extraout_var_02,iVar5),
                      ((undefined8 *)CONCAT44(extraout_var_02,iVar5))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"._Fields> ",10);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)local_1d0);
  generate_struct_desc(this,(ostream *)local_1d0,tstruct);
  generate_field_descs(this,(ostream *)local_1d0,tstruct);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  generate_field_name_constants(this,(ostream *)local_1d0,tstruct);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  generate_java_meta_data_map(this,(ostream *)local_1d0,tstruct);
  generate_union_constructor(this,(ostream *)local_1d0,tstruct);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  generate_union_abstract_methods(this,(ostream *)local_1d0,tstruct);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  generate_java_struct_field_by_id(this,(ostream *)local_1d0,tstruct_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  generate_union_getters_and_setters(this,(ostream *)local_1d0,tstruct);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  generate_union_is_set_methods(this,(ostream *)local_1d0,tstruct);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  generate_union_comparisons(this,(ostream *)local_1d0,tstruct);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  generate_union_hashcode(this,(ostream *)local_1d0,tstruct_01);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  generate_java_struct_write_object(this,(ostream *)local_1d0,tstruct_02);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  generate_java_struct_read_object(this,(ostream *)local_1d0,tstruct);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  poVar8 = (ostream *)local_1d0;
  t_oop_generator::scope_down(&this->super_t_oop_generator,poVar8);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,(int)poVar8);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_138);
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  return;
}

Assistant:

void t_java_generator::generate_java_union(t_struct* tstruct) {
  // Make output file
  string f_struct_name = package_dir_ + "/" + make_valid_java_filename(tstruct->get_name())
                         + ".java";
  ofstream_with_content_based_conditional_update f_struct;
  f_struct.open(f_struct_name.c_str());

  f_struct << autogen_comment() << java_package() << java_suppressions();

  generate_java_doc(f_struct, tstruct);

  bool is_final = (tstruct->annotations_.find("final") != tstruct->annotations_.end());
  bool is_deprecated = this->is_deprecated(tstruct->annotations_);

  if (!suppress_generated_annotations_) {
    generate_javax_generated_annotation(f_struct);
  }

  if (is_deprecated) {
    indent(f_struct) << "@Deprecated" << endl;
  }
  indent(f_struct) << "public " << (is_final ? "final " : "") << "class " << tstruct->get_name()
                   << " extends org.apache.thrift.TUnion<" << tstruct->get_name() << ", "
                   << tstruct->get_name() << "._Fields> ";

  scope_up(f_struct);

  generate_struct_desc(f_struct, tstruct);
  generate_field_descs(f_struct, tstruct);

  f_struct << endl;

  generate_field_name_constants(f_struct, tstruct);

  f_struct << endl;

  generate_java_meta_data_map(f_struct, tstruct);

  generate_union_constructor(f_struct, tstruct);

  f_struct << endl;

  generate_union_abstract_methods(f_struct, tstruct);

  f_struct << endl;

  generate_java_struct_field_by_id(f_struct, tstruct);

  f_struct << endl;

  generate_union_getters_and_setters(f_struct, tstruct);

  f_struct << endl;

  generate_union_is_set_methods(f_struct, tstruct);

  f_struct << endl;

  generate_union_comparisons(f_struct, tstruct);

  f_struct << endl;

  generate_union_hashcode(f_struct, tstruct);

  f_struct << endl;

  generate_java_struct_write_object(f_struct, tstruct);

  f_struct << endl;

  generate_java_struct_read_object(f_struct, tstruct);

  f_struct << endl;

  scope_down(f_struct);

  f_struct.close();
}